

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O0

void __thiscall
Nova::Boundary_Uniform<float,_2>::Find_Ghost_Regions
          (Boundary_Uniform<float,_2> *this,T_Grid *grid,Array<Nova::Range<int,_2>_> *regions,
          int number_of_ghost_cells)

{
  undefined1 local_44 [8];
  Range<int,_2> ghost;
  Range<int,_2> domain;
  int number_of_ghost_cells_local;
  Array<Nova::Range<int,_2>_> *regions_local;
  T_Grid *grid_local;
  Boundary_Uniform<float,_2> *this_local;
  
  Grid<float,_2>::Cell_Indices((Grid<float,_2> *)&ghost.max_corner,(int)grid);
  Range<int,_2>::Thickened((Range<int,_2> *)local_44,(int)&ghost + 8);
  Array<Nova::Range<int,_2>_>::resize(regions,4);
  Find_Ghost_Regions_Helper(regions,(Range<int,_2> *)&ghost.max_corner,(Range<int,_2> *)local_44);
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Find_Ghost_Regions(const T_Grid& grid,Array<Range<int,d> >& regions,const int number_of_ghost_cells) const
{
    Range<int,d> domain=grid.Cell_Indices(),ghost=domain.Thickened(number_of_ghost_cells);
    regions.resize(T_Grid::number_of_faces_per_cell);
    Find_Ghost_Regions_Helper(regions,domain,ghost);
}